

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_Solaris_ACL(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char *pcVar1;
  int64_t iVar2;
  char *_p;
  archive_string_conv *paVar3;
  archive_acl *acl_00;
  int *piVar4;
  char *local_68;
  char *p;
  char *acl;
  int64_t type;
  wchar_t acl_type;
  wchar_t err;
  size_t size;
  archive_entry_header_ustar *header;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  iVar2 = tar_atol((char *)((long)h + 0x7c),0xc);
  a_local._4_4_ = read_body_to_string(a,tar,&tar->acl_text,h,unconsumed);
  if ((a_local._4_4_ == L'\0') &&
     ((a_local._4_4_ = tar_read_header(a,tar,entry,unconsumed), a_local._4_4_ == L'\0' ||
      (a_local._4_4_ == L'\xffffffec')))) {
    pcVar1 = (tar->acl_text).s;
    acl = (char *)0x0;
    for (local_68 = pcVar1; *local_68 != '\0' && local_68 < pcVar1 + iVar2; local_68 = local_68 + 1)
    {
      if ((*local_68 < '0') || ('7' < *local_68)) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (invalid digit)");
        return L'\xffffffec';
      }
      acl = (char *)((long)(*local_68 + -0x30) + (long)acl * 8);
      if (0xffffff < (long)acl) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (count too large)");
        return L'\xffffffec';
      }
    }
    if (((uint)acl & 0xfffc0000) == 0x40000) {
      type._0_4_ = L'Ā';
    }
    else {
      if (((uint)acl & 0xfffc0000) != 0xc0000) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)",
                          (ulong)acl & 0xffffffff);
        return L'\xffffffec';
      }
      type._0_4_ = L'㰀';
    }
    _p = local_68 + 1;
    if (_p < pcVar1 + iVar2) {
      for (local_68 = _p; *local_68 != '\0' && local_68 < _p + (iVar2 - ((long)_p - (long)pcVar1));
          local_68 = local_68 + 1) {
      }
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar3 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar3;
        if (tar->sconv_acl == (archive_string_conv *)0x0) {
          return L'\xffffffe2';
        }
      }
      (tar->localname).length = 0;
      archive_strncat(&tar->localname,_p,(long)local_68 - (long)_p);
      acl_00 = archive_entry_acl(entry);
      a_local._4_4_ =
           archive_acl_from_text_l(acl_00,(tar->localname).s,(wchar_t)type,tar->sconv_acl);
      if (a_local._4_4_ != L'\0') {
        piVar4 = __errno_location();
        if (*piVar4 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for ACL");
        }
        else {
          archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unparsable)");
        }
      }
    }
    else {
      archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (body overflow)");
      a_local._4_4_ = L'\xffffffec';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_Solaris_ACL(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	const struct archive_entry_header_ustar *header;
	size_t size;
	int err, acl_type;
	int64_t type;
	char *acl, *p;

	/*
	 * read_body_to_string adds a NUL terminator, but we need a little
	 * more to make sure that we don't overrun acl_text later.
	 */
	header = (const struct archive_entry_header_ustar *)h;
	size = (size_t)tar_atol(header->size, sizeof(header->size));
	err = read_body_to_string(a, tar, &(tar->acl_text), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Recursively read next header */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/* TODO: Examine the first characters to see if this
	 * is an AIX ACL descriptor.  We'll likely never support
	 * them, but it would be polite to recognize and warn when
	 * we do see them. */

	/* Leading octal number indicates ACL type and number of entries. */
	p = acl = tar->acl_text.s;
	type = 0;
	while (*p != '\0' && p < acl + size) {
		if (*p < '0' || *p > '7') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (invalid digit)");
			return(ARCHIVE_WARN);
		}
		type <<= 3;
		type += *p - '0';
		if (type > 077777777) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (count too large)");
			return (ARCHIVE_WARN);
		}
		p++;
	}
	switch ((int)type & ~0777777) {
	case 01000000:
		/* POSIX.1e ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		break;
	case 03000000:
		/* NFSv4 ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_NFS4;
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (unsupported type %o)",
		    (int)type);
		return (ARCHIVE_WARN);
	}
	p++;

	if (p >= acl + size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (body overflow)");
		return(ARCHIVE_WARN);
	}

	/* ACL text is null-terminated; find the end. */
	size -= (p - acl);
	acl = p;

	while (*p != '\0' && p < acl + size)
		p++;

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL)
			return (ARCHIVE_FATAL);
	}
	archive_strncpy(&(tar->localname), acl, p - acl);
	err = archive_acl_from_text_l(archive_entry_acl(entry),
	    tar->localname.s, acl_type, tar->sconv_acl);
	if (err != ARCHIVE_OK) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for ACL");
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (unparsable)");
	}
	return (err);
}